

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaSAXHandleEndElementNs(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  int iVar1;
  
  if (*(int *)((long)ctx + 0x130) != -1) {
    if (*(int *)((long)ctx + 0x130) < *(int *)((long)ctx + 0xac)) {
      *(int *)((long)ctx + 0xac) = *(int *)((long)ctx + 0xac) + -1;
      return;
    }
    *(undefined4 *)((long)ctx + 0x130) = 0xffffffff;
  }
  iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)((long)ctx + 0xc0) + 0x18),localname);
  if ((iVar1 == 0) ||
     (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)((long)ctx + 0xc0) + 0x20),URI), iVar1 == 0)) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleEndElementNs","elem pop mismatch");
  }
  iVar1 = xmlSchemaValidatorPopElem((xmlSchemaValidCtxtPtr)ctx);
  if (-1 < iVar1) {
    return;
  }
  xmlSchemaInternalErr
            ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleEndElementNs",
             "calling xmlSchemaValidatorPopElem()");
  *(undefined4 *)((long)ctx + 0x68) = 0xffffffff;
  xmlStopParser(*(xmlParserCtxtPtr *)((long)ctx + 0x50));
  return;
}

Assistant:

static void
xmlSchemaSAXHandleEndElementNs(void *ctx,
			       const xmlChar * localname ATTRIBUTE_UNUSED,
			       const xmlChar * prefix ATTRIBUTE_UNUSED,
			       const xmlChar * URI ATTRIBUTE_UNUSED)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int res;

    /*
    * Skip elements if inside a "skip" wildcard or if invalid.
    */
    if (vctxt->skipDepth != -1) {
	if (vctxt->depth > vctxt->skipDepth) {
	    vctxt->depth--;
	    return;
	} else
	    vctxt->skipDepth = -1;
    }
    /*
    * SAX VAL TODO: Just a temporary check.
    */
    if ((!xmlStrEqual(vctxt->inode->localName, localname)) ||
	(!xmlStrEqual(vctxt->inode->nsName, URI))) {
	VERROR_INT("xmlSchemaSAXHandleEndElementNs",
	    "elem pop mismatch");
    }
    res = xmlSchemaValidatorPopElem(vctxt);
    if (res != 0) {
	if (res < 0) {
	    VERROR_INT("xmlSchemaSAXHandleEndElementNs",
		"calling xmlSchemaValidatorPopElem()");
	    goto internal_error;
	}
	goto exit;
    }
exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
}